

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_genn.cc
# Opt level: O0

GENERAL_NAME * GENERAL_NAME_dup(GENERAL_NAME *a)

{
  GENERAL_NAME *pGVar1;
  GENERAL_NAME *x_local;
  
  pGVar1 = (GENERAL_NAME *)ASN1_item_dup((ASN1_ITEM *)&GENERAL_NAME_it,a);
  return pGVar1;
}

Assistant:

static int edipartyname_cmp(const EDIPARTYNAME *a, const EDIPARTYNAME *b) {
  // nameAssigner is optional and may be NULL.
  if (a->nameAssigner == NULL) {
    if (b->nameAssigner != NULL) {
      return -1;
    }
  } else {
    if (b->nameAssigner == NULL ||
        ASN1_STRING_cmp(a->nameAssigner, b->nameAssigner) != 0) {
      return -1;
    }
  }

  // partyName may not be NULL.
  return ASN1_STRING_cmp(a->partyName, b->partyName);
}